

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

bool __thiscall LinkedObjectFile::is_string(LinkedObjectFile *this,int seg,int byte_idx)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  if (((byte_idx & 3U) == 0) && (3 < byte_idx)) {
    uVar7 = (ulong)seg;
    pvVar1 = (this->words_by_seg).
             super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->words_by_seg).
                   super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x5555555555555555;
    if (uVar4 < uVar7 || uVar4 - uVar7 == 0) {
LAB_00130aa8:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,
                 uVar4);
    }
    uVar6 = byte_idx - 4;
    lVar2 = *(long *)&pvVar1[uVar7].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                      _M_impl.super__Vector_impl_data;
    lVar5 = (long)*(pointer *)
                   ((long)&pvVar1[uVar7].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>
                           ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 4;
    uVar4 = lVar5 * -0x5555555555555555;
    uVar7 = lVar5 * -0x5555555555555554;
    if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
      uVar7 = (ulong)(uVar6 >> 2);
      if (uVar4 < uVar7 || uVar4 - uVar7 == 0) goto LAB_00130aa8;
      if (*(int *)(lVar2 + uVar7 * 0x30) == 7) {
        iVar3 = std::__cxx11::string::compare((char *)(lVar2 + uVar7 * 0x30 + 0x10));
        return iVar3 == 0;
      }
    }
  }
  return false;
}

Assistant:

bool LinkedObjectFile::is_string(int seg, int byte_idx) {
  if (byte_idx % 4) {
    return false;  // must be aligned pointer.
  }
  int type_tag_ptr = byte_idx - 4;
  // must fit in segment
  if (type_tag_ptr < 0 || size_t(type_tag_ptr) >= words_by_seg.at(seg).size() * 4) {
    return false;
  }
  auto& type_word = words_by_seg.at(seg).at(type_tag_ptr / 4);
  return type_word.kind == LinkedWord::TYPE_PTR && type_word.symbol_name == "string";
}